

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::level_formatter<spdlog::details::scoped_padder>::format
          (level_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t *this_00;
  long in_RSI;
  scoped_padder *in_RDI;
  scoped_padder p;
  string_view_t *level_name;
  memory_buf_t *in_stack_ffffffffffffff88;
  memory_buf_t *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  scoped_padder *in_stack_ffffffffffffffa0;
  
  this_00 = level::to_string_view(*(level_enum *)(in_RSI + 0x10));
  fmt::v7::basic_string_view<char>::size(this_00);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (padding_info *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  fmt_helper::append_string_view(*this_00,in_stack_ffffffffffffff90);
  scoped_padder::~scoped_padder(in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }